

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_bench.cxx
# Opt level: O2

int raft_bench::worker_func(ThreadArgs *_args)

{
  pthread_mutex_t *__mutex;
  vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_> *logs;
  long lVar1;
  long lVar2;
  size_t sVar3;
  uint64_t lat_value;
  shared_ptr<nuraft::buffer> *psVar4;
  ostream *poVar5;
  int iVar6;
  lock_guard<std::mutex> l;
  initializer_list<std::shared_ptr<nuraft::buffer>_> __l;
  allocator_type local_99;
  string local_98;
  __shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2> local_78;
  ptr<raft_result> ret;
  ptr<buffer> msg;
  Timer timer;
  
  nuraft::buffer::alloc((buffer *)&msg,*(size_t *)(*(long *)_args + 0x40));
  nuraft::buffer::put(msg.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr,'\0'
                     );
  __mutex = (pthread_mutex_t *)(_args + 0x40);
LAB_0017ba06:
  do {
    if (((byte)_args[0x10] & 1) != 0) {
      iVar6 = 0;
LAB_0017bfcc:
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&msg.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      return iVar6;
    }
    std::mutex::lock((mutex *)&__mutex->__data);
    sVar3 = TestSuite::WorkloadGenerator::getNumOpsToDo((WorkloadGenerator *)(_args + 0x20));
    pthread_mutex_unlock(__mutex);
    if (sVar3 != 0) {
      timer.start.__d.__r = (duration)0;
      timer.duration_ms = 0;
      timer.start.__d.__r = (duration)std::chrono::_V2::system_clock::now();
      nuraft::buffer::pos(msg.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                          0);
      logs = *(vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
               **)(*(long *)(_args + 8) + 0xb0);
      std::__shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_78,&msg.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>);
      __l._M_len = 1;
      __l._M_array = (iterator)&local_78;
      std::
      vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>::
      vector((vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
              *)&local_98,__l,&local_99);
      nuraft::raft_server::append_entries((raft_server *)&ret,logs);
      std::
      vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>::
      ~vector((vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
               *)&local_98);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_78._M_refcount);
      std::__cxx11::string::string((string *)&local_98,"rep",(allocator *)&local_78);
      lat_value = TestSuite::Timer::getTimeUs(&timer);
      LatencyCollector::addLatency((LatencyCollector *)global_lat,&local_98,lat_value);
      std::__cxx11::string::~string((string *)&local_98);
      if ((ret.
           super___shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr)->accepted_ == false) {
        poVar5 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
        poVar5 = std::operator<<(poVar5,"        time: ");
        poVar5 = std::operator<<(poVar5,"\x1b[1;30m");
        TestSuite::getTimeString_abi_cxx11_();
        poVar5 = std::operator<<(poVar5,(string *)&local_98);
        poVar5 = std::operator<<(poVar5,"\x1b[0m");
        poVar5 = std::operator<<(poVar5,"\n");
        poVar5 = std::operator<<(poVar5,"      thread: ");
        poVar5 = std::operator<<(poVar5,"\x1b[33m");
        lVar1 = *(long *)poVar5;
        lVar2 = *(long *)(lVar1 + -0x18);
        *(uint *)(poVar5 + lVar2 + 0x18) = *(uint *)(poVar5 + lVar2 + 0x18) & 0xffffffb5 | 8;
        *(undefined8 *)(poVar5 + *(long *)(lVar1 + -0x18) + 0x10) = 4;
        poVar5 = std::operator<<(poVar5,0x30);
        local_78._M_ptr = (element_type *)pthread_self();
        std::hash<std::thread::id>::operator()((hash<std::thread::id> *)&local_99,(id *)&local_78);
        poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
        *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) =
             *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) & 0xffffffb5 | 2;
        poVar5 = std::operator<<(poVar5,"\x1b[0m");
        poVar5 = std::operator<<(poVar5,"\n");
        poVar5 = std::operator<<(poVar5,"          in: ");
        poVar5 = std::operator<<(poVar5,"\x1b[36m");
        poVar5 = std::operator<<(poVar5,"worker_func");
        poVar5 = std::operator<<(poVar5,"()\x1b[0m");
        poVar5 = std::operator<<(poVar5,"\n");
        poVar5 = std::operator<<(poVar5,"          at: ");
        poVar5 = std::operator<<(poVar5,"\x1b[32m");
        poVar5 = std::operator<<(poVar5,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/bench/raft_bench.cxx"
                                );
        poVar5 = std::operator<<(poVar5,"\x1b[0m:");
        poVar5 = std::operator<<(poVar5,"\x1b[1;35m");
        poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,0x133);
        poVar5 = std::operator<<(poVar5,"\x1b[0m");
        poVar5 = std::operator<<(poVar5,"\n");
        poVar5 = std::operator<<(poVar5,"    value of: \x1b[1;34mret->get_accepted()\x1b[0m\n");
        poVar5 = std::operator<<(poVar5,"    expected: \x1b[1;32m");
        poVar5 = std::operator<<(poVar5,"true");
        poVar5 = std::operator<<(poVar5,"\x1b[0m\n");
        poVar5 = std::operator<<(poVar5,"      actual: \x1b[1;31m");
        poVar5 = std::operator<<(poVar5,"false");
        std::operator<<(poVar5,"\x1b[0m\n");
      }
      else {
        psVar4 = nuraft::
                 cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>::get
                           (ret.
                            super___shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr);
        if ((psVar4->super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr !=
            (element_type *)0x0) {
          std::mutex::lock((mutex *)&__mutex->__data);
          *(long *)(_args + 0x38) = *(long *)(_args + 0x38) + 1;
          pthread_mutex_unlock(__mutex);
          LOCK();
          *(long *)(_args + 0x18) = *(long *)(_args + 0x18) + 1;
          UNLOCK();
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&ret.
                      super___shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount);
          goto LAB_0017ba06;
        }
        poVar5 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
        poVar5 = std::operator<<(poVar5,"        time: ");
        poVar5 = std::operator<<(poVar5,"\x1b[1;30m");
        TestSuite::getTimeString_abi_cxx11_();
        poVar5 = std::operator<<(poVar5,(string *)&local_98);
        poVar5 = std::operator<<(poVar5,"\x1b[0m");
        poVar5 = std::operator<<(poVar5,"\n");
        poVar5 = std::operator<<(poVar5,"      thread: ");
        poVar5 = std::operator<<(poVar5,"\x1b[33m");
        lVar1 = *(long *)poVar5;
        lVar2 = *(long *)(lVar1 + -0x18);
        *(uint *)(poVar5 + lVar2 + 0x18) = *(uint *)(poVar5 + lVar2 + 0x18) & 0xffffffb5 | 8;
        *(undefined8 *)(poVar5 + *(long *)(lVar1 + -0x18) + 0x10) = 4;
        poVar5 = std::operator<<(poVar5,0x30);
        local_78._M_ptr = (element_type *)pthread_self();
        std::hash<std::thread::id>::operator()((hash<std::thread::id> *)&local_99,(id *)&local_78);
        poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
        *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) =
             *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) & 0xffffffb5 | 2;
        poVar5 = std::operator<<(poVar5,"\x1b[0m");
        poVar5 = std::operator<<(poVar5,"\n");
        poVar5 = std::operator<<(poVar5,"          in: ");
        poVar5 = std::operator<<(poVar5,"\x1b[36m");
        poVar5 = std::operator<<(poVar5,"worker_func");
        poVar5 = std::operator<<(poVar5,"()\x1b[0m");
        poVar5 = std::operator<<(poVar5,"\n");
        poVar5 = std::operator<<(poVar5,"          at: ");
        poVar5 = std::operator<<(poVar5,"\x1b[32m");
        poVar5 = std::operator<<(poVar5,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/bench/raft_bench.cxx"
                                );
        poVar5 = std::operator<<(poVar5,"\x1b[0m:");
        poVar5 = std::operator<<(poVar5,"\x1b[1;35m");
        poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,0x134);
        poVar5 = std::operator<<(poVar5,"\x1b[0m");
        poVar5 = std::operator<<(poVar5,"\n");
        poVar5 = std::operator<<(poVar5,"    value of: \x1b[1;34mret->get()\x1b[0m\n");
        poVar5 = std::operator<<(poVar5,"    expected: \x1b[1;32m");
        poVar5 = std::operator<<(poVar5,"non-NULL");
        poVar5 = std::operator<<(poVar5,"\x1b[0m\n");
        poVar5 = std::operator<<(poVar5,"      actual: \x1b[1;31m");
        poVar5 = std::operator<<(poVar5,"NULL");
        std::operator<<(poVar5,"\x1b[0m\n");
      }
      std::__cxx11::string::~string((string *)&local_98);
      TestSuite::failHandler();
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&ret.
                  super___shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      iVar6 = -1;
      goto LAB_0017bfcc;
    }
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    local_98._M_string_length = 0;
    local_98.field_2._M_local_buf[0] = '\0';
    TestSuite::sleep_ms(1,&local_98);
    std::__cxx11::string::~string((string *)&local_98);
  } while( true );
}

Assistant:

int worker_func(TestSuite::ThreadArgs* _args) {
    worker_params* args = static_cast<worker_params*>(_args);

    ptr<buffer> msg = buffer::alloc(args->config_.payload_size_);
    msg->put( (byte)0x0 );

    while (!args->stop_signal_) {
        size_t num_ops = 0;
        {   std::lock_guard<std::mutex> l(args->wg_lock_);
            num_ops = args->wg_.getNumOpsToDo();
        }
        if (!num_ops) {
            TestSuite::sleep_ms(1);
            continue;
        }

        TestSuite::Timer timer;

        msg->pos(0);
        ptr<raft_result> ret =
            args->stuff_.raft_instance_->append_entries( {msg} );
        global_lat.addLatency("rep", timer.getTimeUs());

        CHK_TRUE( ret->get_accepted() );
        CHK_NONNULL( ret->get() );

        {   std::lock_guard<std::mutex> l(args->wg_lock_);
            args->wg_.addNumOpsDone(1);
        }
        args->num_ops_done_.fetch_add(1);
    }

    return 0;
}